

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.h
# Opt level: O0

UnicodeString * __thiscall
icu_63::UnicodeString::findAndReplace
          (UnicodeString *this,UnicodeString *oldText,UnicodeString *newText)

{
  int32_t length;
  int32_t oldLength;
  int32_t newLength;
  UnicodeString *pUVar1;
  UnicodeString *newText_local;
  UnicodeString *oldText_local;
  UnicodeString *this_local;
  
  length = UnicodeString::length(this);
  oldLength = UnicodeString::length(oldText);
  newLength = UnicodeString::length(newText);
  pUVar1 = findAndReplace(this,0,length,oldText,0,oldLength,newText,0,newLength);
  return pUVar1;
}

Assistant:

inline UnicodeString&
UnicodeString::findAndReplace(const UnicodeString& oldText,
                  const UnicodeString& newText)
{ return findAndReplace(0, length(), oldText, 0, oldText.length(),
            newText, 0, newText.length()); }